

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O0

int bp_decode_ps_min_synd
              (mod2sparse *H,char *synd,double error_prob,int max_iter,int *converge,int *iter,
              char *decoding,double *log_prob_ratios)

{
  int iVar1;
  bool bVar2;
  uint n;
  void *__src;
  void *__ptr;
  mod2sparse *in_RCX;
  int in_EDX;
  char *in_RSI;
  mod2sparse *in_RDI;
  int *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  int check_no;
  int hamming_weight_min;
  int synd_weight;
  int decreased;
  double *log_prob_ratios_save;
  char *candidate_synd;
  int hamming_weight;
  int it;
  int N;
  int M;
  char *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffffb0;
  uint uVar3;
  int iVar4;
  int len;
  
  len = in_RDI->n_rows;
  iVar1 = in_RDI->n_cols;
  bVar2 = false;
  n = bin_char_weight(in_RSI,len);
  __src = chk_alloc(n,in_stack_ffffffffffffff90);
  __ptr = chk_alloc(n,in_stack_ffffffffffffff90);
  bp_setup_ps(in_RDI,in_XMM0_Qa,_check_no,(char *)in_R9);
  iVar4 = 0;
  while( true ) {
    if (in_EDX <= iVar4) {
      if (bVar2) {
        memcpy(_check_no,__src,(long)iVar1 << 3);
      }
      free(__ptr);
      free(__src);
      *in_R8 = iVar4;
      in_RCX->n_rows = 0;
      return 0;
    }
    bp_update_ps(in_RCX,(char *)in_R8,in_R9,len,(char *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
    syndrome((mod2sparse *)CONCAT44(n,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
             (char *)0x16dda5);
    uVar3 = 0;
    for (in_stack_ffffffffffffff90 = 0; (int)in_stack_ffffffffffffff90 < len;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
      uVar3 = (int)(char)(in_RSI[(int)in_stack_ffffffffffffff90] ^
                         *(byte *)((long)__ptr + (long)(int)in_stack_ffffffffffffff90)) + uVar3;
    }
    if (uVar3 == 0) break;
    in_stack_ffffffffffffffb0 = uVar3;
    if ((int)uVar3 < (int)n) {
      memcpy(__src,_check_no,(long)iVar1 << 3);
      bVar2 = true;
      n = uVar3;
    }
    iVar4 = iVar4 + 1;
  }
  free(__ptr);
  free(__src);
  *in_R8 = iVar4;
  in_RCX->n_rows = 1;
  return 1;
}

Assistant:

int bp_decode_ps_min_synd(
        mod2sparse *H,
        char *synd,
        double error_prob,
        int max_iter,
        int *converge,
        int *iter,
        char *decoding,
        double *log_prob_ratios)
{

    int M,N;
    int it;
    M = mod2sparse_rows(H);
    N = mod2sparse_cols(H);
    int hamming_weight;
    char *candidate_synd;
    double *log_prob_ratios_save;

    int decreased=0;

    int synd_weight=bin_char_weight(synd,M);
    int hamming_weight_min=synd_weight;

    log_prob_ratios_save=chk_alloc(N,sizeof(*log_prob_ratios_save));
    candidate_synd=chk_alloc(M,sizeof(*candidate_synd));

    bp_setup_ps(H,error_prob,log_prob_ratios,decoding);

    for(it=0; it<max_iter;it++)
    {
        bp_update_ps(H,synd, log_prob_ratios, it, decoding);
        syndrome(H,decoding,candidate_synd);

        hamming_weight=0;
        for(int check_no=0;check_no<M;check_no++)
        {
            hamming_weight+=synd[check_no]^candidate_synd[check_no];
        }

        if(hamming_weight==0)
        {
            free(candidate_synd);
            free(log_prob_ratios_save);
            *iter=it;
            *converge=1;
            return 1;
        }


        if(hamming_weight<hamming_weight_min){
            hamming_weight_min=hamming_weight;
            memcpy(log_prob_ratios_save,log_prob_ratios,N*sizeof(*log_prob_ratios));
            decreased=1;
        }

    }

    if(decreased) memcpy(log_prob_ratios,log_prob_ratios_save,N*sizeof(*log_prob_ratios));


    free(candidate_synd);
    free(log_prob_ratios_save);
    *iter=it;
    *converge=0;
    return 0;
}